

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O2

int __thiscall
CVmObject::getp_is_class
          (CVmObject *this,vm_obj_id_t self,vm_val_t *retval,uint *argc,vm_prop_id_t param_4,
          vm_obj_id_t *param_5)

{
  int iVar1;
  
  if (getp_is_class(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)::desc == '\0'
     ) {
    iVar1 = __cxa_guard_acquire(&getp_is_class(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                                 ::desc);
    if (iVar1 != 0) {
      getp_is_class::desc.min_argc_ = 0;
      getp_is_class::desc.opt_argc_ = 0;
      getp_is_class::desc.varargs_ = 0;
      __cxa_guard_release(&getp_is_class(unsigned_int,vm_val_t*,unsigned_int*,unsigned_short,unsigned_int*)
                           ::desc);
    }
  }
  iVar1 = get_prop_check_argc(retval,argc,&getp_is_class::desc);
  if (iVar1 == 0) {
    iVar1 = (*this->_vptr_CVmObject[6])(this,self);
    retval->typ = VM_TRUE - (iVar1 == 0);
  }
  return 1;
}

Assistant:

int CVmObject::getp_is_class(VMG_ vm_obj_id_t self,
                             vm_val_t *retval, uint *argc,
                             vm_prop_id_t, vm_obj_id_t *)
{
    static CVmNativeCodeDesc desc(0);

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* indicate whether or not we're a class object */
    retval->set_logical(is_class_object(vmg_ self));

    /* handled */
    return TRUE;
}